

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmulNet.cpp
# Opt level: O3

int __thiscall EmulNet::ENcleanup(EmulNet *this)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int (*local_48) [3600];
  
  (this->emulnet).nextid = 0;
  __stream = fopen("msgcount.log","w+");
  while (iVar5 = (this->emulnet).currbuffsize, 0 < iVar5) {
    uVar4 = iVar5 - 1;
    (this->emulnet).currbuffsize = uVar4;
    free((this->emulnet).buff[uVar4]);
  }
  if (0 < this->par->EN_GPSZ) {
    local_48 = this->recv_msgs;
    uVar6 = 1;
    do {
      local_48 = local_48 + 1;
      fprintf(__stream,"node %3d ",uVar6);
      iVar5 = Params::getcurrtime(this->par);
      uVar4 = 0;
      uVar8 = 0;
      if (0 < iVar5) {
        uVar7 = 0;
        uVar8 = 0;
        uVar4 = 0;
        do {
          uVar1 = local_48[-0x3e9][uVar7];
          uVar2 = (*local_48)[uVar7];
          if (uVar6 == 0x43) {
            fprintf(__stream,"special %4d %4d %4d\n",uVar7 & 0xffffffff,(ulong)uVar1,(ulong)uVar2);
          }
          else {
            fprintf(__stream," (%4d, %4d)",(ulong)uVar1,(ulong)uVar2);
            if ((int)(uVar7 / 10) * 10 + 9 == (int)uVar7) {
              fwrite("\n         ",10,1,__stream);
            }
          }
          uVar4 = uVar4 + uVar1;
          uVar8 = uVar8 + uVar2;
          uVar7 = uVar7 + 1;
          iVar5 = Params::getcurrtime(this->par);
        } while ((long)uVar7 < (long)iVar5);
      }
      fputc(10,__stream);
      fprintf(__stream,"node %3d sent_total %6u  recv_total %6u\n\n",uVar6 & 0xffffffff,(ulong)uVar4
              ,(ulong)uVar8);
      bVar3 = (long)uVar6 < (long)this->par->EN_GPSZ;
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  fclose(__stream);
  return 0;
}

Assistant:

int EmulNet::ENcleanup() {
	emulnet.nextid=0;
	int i, j;
	int sent_total, recv_total;

	FILE* file = fopen("msgcount.log", "w+");

	while(emulnet.currbuffsize > 0) {
		free(emulnet.buff[--emulnet.currbuffsize]);
	}

	for ( i = 1; i <= par->EN_GPSZ; i++ ) {
		fprintf(file, "node %3d ", i);
		sent_total = 0;
		recv_total = 0;

		for (j = 0; j < par->getcurrtime(); j++) {

			sent_total += sent_msgs[i][j];
			recv_total += recv_msgs[i][j];
			if (i != 67) {
				fprintf(file, " (%4d, %4d)", sent_msgs[i][j], recv_msgs[i][j]);
				if (j % 10 == 9) {
					fprintf(file, "\n         ");
				}
			}
			else {
				fprintf(file, "special %4d %4d %4d\n", j, sent_msgs[i][j], recv_msgs[i][j]);
			}
		}
		fprintf(file, "\n");
		fprintf(file, "node %3d sent_total %6u  recv_total %6u\n\n", i, sent_total, recv_total);
	}

	fclose(file);
	return 0;
}